

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

void __thiscall soul::StructuralParser::parseSpecialisationParameters(StructuralParser *this)

{
  ModuleBase *pMVar1;
  bool bVar2;
  int iVar3;
  Identifier IVar4;
  PoolItem *pPVar5;
  Expression *pEVar6;
  ProcessorAliasDeclaration *pPVar7;
  NamespaceAliasDeclaration *pNVar8;
  Context context;
  Identifier local_78;
  CompileMessage local_70;
  _Alloc_hider local_38;
  
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2af3de);
  if (bVar2) {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2acfd0);
    if (!bVar2) {
      do {
        bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289289);
        if (bVar2) {
          pMVar1 = (this->module).object;
          if (pMVar1 == (ModuleBase *)0x0) goto LAB_001ff74c;
          iVar3 = (*(pMVar1->super_ASTObject)._vptr_ASTObject[5])();
          if ((char)iVar3 != '\0') {
            CompileMessageHelpers::createMessage<>
                      (&local_70,syntax,error,"Graphs cannot have type specialisations");
            (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_70);
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_70.location.sourceCode.object);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70.description._M_dataplus._M_p != &local_70.description.field_2) {
              operator_delete(local_70.description._M_dataplus._M_p,
                              (ulong)(local_70.description.field_2._M_allocated_capacity + 1));
            }
          }
          local_70.description._M_dataplus._M_p =
               (pointer)(this->super_SOULTokeniser).location.sourceCode.object;
          if ((SourceCodeText *)local_70.description._M_dataplus._M_p != (SourceCodeText *)0x0) {
            (((SourceCodeText *)local_70.description._M_dataplus._M_p)->super_RefCountedObject).
            refCount = (((SourceCodeText *)local_70.description._M_dataplus._M_p)->
                       super_RefCountedObject).refCount + 1;
          }
          local_70.description._M_string_length =
               (size_type)(this->super_SOULTokeniser).location.location.data;
          local_70.description.field_2._M_allocated_capacity = (size_type)this->currentScope;
          IVar4 = parseIdentifier(this);
          pPVar5 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x40);
          local_78.name = (string *)0x0;
          AST::UsingDeclaration::UsingDeclaration
                    ((UsingDeclaration *)&pPVar5->item,(Context *)&local_70,IVar4,
                     (pool_ptr<soul::AST::Expression> *)&local_78);
          pPVar5->destructor =
               PoolAllocator::
               allocate<soul::AST::UsingDeclaration,_soul::AST::Context_&,_soul::Identifier_&,_std::nullptr_t>
               ::anon_class_1_0_00000001::__invoke;
          bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d51);
          if (bVar2) {
            pEVar6 = parseType(this,variableType);
            pPVar5[2].destructor = (DestructorFn *)pEVar6;
          }
          pMVar1 = (this->module).object;
          if (pMVar1 == (ModuleBase *)0x0) {
            throwInternalCompilerError("object != nullptr","operator->",0x3c);
          }
          (*(pMVar1->super_ASTObject)._vptr_ASTObject[0x11])(pMVar1,&pPVar5->item);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                    ((SourceCodeText *)local_70.description._M_dataplus._M_p);
        }
        else {
          bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2ab7e1);
          if (bVar2) {
            pMVar1 = (this->module).object;
            if (pMVar1 == (ModuleBase *)0x0) goto LAB_001ff74c;
            iVar3 = (*(pMVar1->super_ASTObject)._vptr_ASTObject[5])();
            if ((char)iVar3 == '\0') {
              CompileMessageHelpers::createMessage<>
                        (&local_70,syntax,error,
                         "Processor specialisations may only be used in graphs");
              (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_70);
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_70.location.sourceCode.object)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70.description._M_dataplus._M_p != &local_70.description.field_2) {
                operator_delete(local_70.description._M_dataplus._M_p,
                                (ulong)(local_70.description.field_2._M_allocated_capacity + 1));
              }
            }
            local_70.description._M_dataplus._M_p =
                 (pointer)(this->super_SOULTokeniser).location.sourceCode.object;
            if ((SourceCodeText *)local_70.description._M_dataplus._M_p != (SourceCodeText *)0x0) {
              (((SourceCodeText *)local_70.description._M_dataplus._M_p)->super_RefCountedObject).
              refCount = (((SourceCodeText *)local_70.description._M_dataplus._M_p)->
                         super_RefCountedObject).refCount + 1;
            }
            local_70.description._M_string_length =
                 (size_type)(this->super_SOULTokeniser).location.location.data;
            local_70.description.field_2._M_allocated_capacity = (size_type)this->currentScope;
            local_78 = parseIdentifier(this);
            pPVar7 = PoolAllocator::
                     allocate<soul::AST::ProcessorAliasDeclaration,soul::AST::Context&,soul::Identifier>
                               (&this->allocator->pool,(Context *)&local_70,&local_78);
            bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d51);
            if (bVar2) {
              pEVar6 = parseType(this,nameOrType);
              (pPVar7->targetProcessor).object = pEVar6;
            }
            pMVar1 = (this->module).object;
            if (pMVar1 == (ModuleBase *)0x0) {
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
            (*(pMVar1->super_ASTObject)._vptr_ASTObject[0x12])(pMVar1,pPVar7);
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                      ((SourceCodeText *)local_70.description._M_dataplus._M_p);
          }
          else {
            bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2ab25c);
            if (bVar2) {
              pMVar1 = (this->module).object;
              if (pMVar1 == (ModuleBase *)0x0) {
LAB_001ff74c:
                throwInternalCompilerError("object != nullptr","operator->",0x3c);
              }
              iVar3 = (*(pMVar1->super_ASTObject)._vptr_ASTObject[6])();
              if ((char)iVar3 == '\0') {
                CompileMessageHelpers::createMessage<>
                          (&local_70,syntax,error,
                           "Namespace specialisations may only be used in namespaces");
                (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_70);
                RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                          (local_70.location.sourceCode.object);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70.description._M_dataplus._M_p != &local_70.description.field_2) {
                  operator_delete(local_70.description._M_dataplus._M_p,
                                  (ulong)(local_70.description.field_2._M_allocated_capacity + 1));
                }
              }
              local_70.description._M_dataplus._M_p =
                   (pointer)(this->super_SOULTokeniser).location.sourceCode.object;
              if ((SourceCodeText *)local_70.description._M_dataplus._M_p != (SourceCodeText *)0x0)
              {
                (((SourceCodeText *)local_70.description._M_dataplus._M_p)->super_RefCountedObject).
                refCount = (((SourceCodeText *)local_70.description._M_dataplus._M_p)->
                           super_RefCountedObject).refCount + 1;
              }
              local_70.description._M_string_length =
                   (size_type)(this->super_SOULTokeniser).location.location.data;
              local_70.description.field_2._M_allocated_capacity = (size_type)this->currentScope;
              local_78 = parseIdentifier(this);
              pNVar8 = PoolAllocator::
                       allocate<soul::AST::NamespaceAliasDeclaration,soul::AST::Context&,soul::Identifier>
                                 (&this->allocator->pool,(Context *)&local_70,&local_78);
              bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d51);
              if (bVar2) {
                pEVar6 = parseType(this,nameOrType);
                (pNVar8->targetNamespace).object = pEVar6;
              }
              pMVar1 = (this->module).object;
              if (pMVar1 == (ModuleBase *)0x0) {
                throwInternalCompilerError("object != nullptr","operator->",0x3c);
              }
              (*(pMVar1->super_ASTObject)._vptr_ASTObject[0x13])(pMVar1,pNVar8);
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                        ((SourceCodeText *)local_70.description._M_dataplus._M_p);
            }
            else {
              giveErrorOnExternalKeyword(this);
              pEVar6 = parseType(this,processorParameter);
              local_70.description._M_dataplus._M_p =
                   (pointer)(this->super_SOULTokeniser).location.sourceCode.object;
              if ((SourceCodeText *)local_70.description._M_dataplus._M_p != (SourceCodeText *)0x0)
              {
                (((SourceCodeText *)local_70.description._M_dataplus._M_p)->super_RefCountedObject).
                refCount = (((SourceCodeText *)local_70.description._M_dataplus._M_p)->
                           super_RefCountedObject).refCount + 1;
              }
              local_70.description._M_string_length =
                   (size_type)(this->super_SOULTokeniser).location.location.data;
              local_70.description.field_2._M_allocated_capacity = (size_type)this->currentScope;
              pPVar5 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x78);
              local_38._M_p = (pointer)0x0;
              local_78.name = (string *)pEVar6;
              AST::VariableDeclaration::VariableDeclaration
                        ((VariableDeclaration *)&pPVar5->item,(Context *)&local_70,
                         (pool_ptr<soul::AST::Expression> *)&local_78,
                         (pool_ptr<soul::AST::Expression> *)&local_38,true);
              pPVar5->destructor =
                   PoolAllocator::
                   allocate<soul::AST::VariableDeclaration,_soul::AST::Context,_soul::AST::Expression_&,_std::nullptr_t,_bool>
                   ::anon_class_1_0_00000001::__invoke;
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                        ((SourceCodeText *)local_70.description._M_dataplus._M_p);
              *(undefined1 *)((long)&pPVar5[3].destructor + 3) = 1;
              IVar4 = parseIdentifier(this);
              *(string **)&pPVar5[1].field_0x18 = IVar4.name;
              bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d51);
              if (bVar2) {
                pEVar6 = parseExpression(this,false);
                pPVar5[2].destructor = (DestructorFn *)pEVar6;
              }
              pMVar1 = (this->module).object;
              if (pMVar1 == (ModuleBase *)0x0) goto LAB_001ff74c;
              (*(pMVar1->super_ASTObject)._vptr_ASTObject[0x10])(pMVar1,&pPVar5->item);
            }
          }
        }
        bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d49);
      } while (bVar2);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2acfd0);
    }
  }
  return;
}

Assistant:

void parseSpecialisationParameters()
    {
        if (matchIf (Operator::openParen))
        {
            if (matchIf (Operator::closeParen))
                return;

            do
            {
                if (matchIf (Keyword::using_))
                {
                    if (module->isGraph())
                        throwError (Errors::graphCannotHaveSpecialisations());

                    auto context = getContext();
                    auto name = parseIdentifier();

                    auto& usingDeclaration = allocate<AST::UsingDeclaration> (context, name, nullptr);

                    if (matchIf (Operator::assign))
                        usingDeclaration.targetType = parseType (ParseTypeContext::variableType);

                    module->addSpecialisationParameter (usingDeclaration);
                }
                else if (matchIf (Keyword::processor))
                {
                    if (! module->isGraph())
                        throwError (Errors::processorSpecialisationNotAllowed());

                    auto context = getContext();
                    auto& processorAliasDeclaration = allocate<AST::ProcessorAliasDeclaration> (context, parseIdentifier());

                    if (matchIf (Operator::assign))
                        processorAliasDeclaration.targetProcessor = parseType (ParseTypeContext::nameOrType);

                    module->addSpecialisationParameter (processorAliasDeclaration);
                }
                else if (matchIf (Keyword::namespace_))
                {
                    if (! module->isNamespace())
                        throwError (Errors::namespaceSpecialisationNotAllowed());

                    auto context = getContext();
                    auto& namespaceAliasDeclaration = allocate<AST::NamespaceAliasDeclaration> (context, parseIdentifier());

                    if (matchIf (Operator::assign))
                        namespaceAliasDeclaration.targetNamespace = parseType (ParseTypeContext::nameOrType);

                    module->addSpecialisationParameter (namespaceAliasDeclaration);
                }
                else
                {
                    giveErrorOnExternalKeyword();
                    auto& parameterType = parseType (ParseTypeContext::processorParameter);
                    auto& parameterVariable = allocate<AST::VariableDeclaration> (getContext(), parameterType, nullptr, true);
                    parameterVariable.isSpecialisation = true;
                    parameterVariable.name = parseIdentifier();

                    if (matchIf (Operator::assign))
                        parameterVariable.initialValue = parseExpression();

                    module->addSpecialisationParameter (parameterVariable);
                }
            }
            while (matchIf (Operator::comma));

            expect (Operator::closeParen);
        }
    }